

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O1

FT_Error T42_Face_Init(FT_Stream stream,FT_Face t42face,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  FT_Memory memory;
  FT_Stream stream_00;
  uchar *puVar5;
  FT_GlyphSlot_conflict pFVar6;
  FT_Library __s2;
  FT_Bitmap_Size *pFVar7;
  FT_ULong count;
  FT_Pos FVar8;
  FT_Pos FVar9;
  FT_Pos FVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  undefined1 auVar13 [16];
  FT_Int FVar14;
  undefined8 uVar15;
  FT_Error FVar16;
  int iVar17;
  uint uVar18;
  FT_Pointer pvVar19;
  FT_String *pFVar20;
  char *pcVar21;
  FT_Byte *buffer;
  char *pcVar22;
  char *pcVar23;
  FT_Face pFVar24;
  FT_CMap_Class clazz;
  uint uVar25;
  long lVar26;
  FT_Face pFVar27;
  ulong uVar28;
  undefined8 *puVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  T42_LoaderRec loader;
  uint local_2e4;
  ulong local_2e0;
  FT_Int local_2d4;
  FT_Face local_2d0;
  FT_Face local_2c8;
  FT_Face local_2c0 [2];
  int local_2b0;
  char *local_2a8;
  FT_Pointer local_2a0;
  FT_Parameter *local_298;
  FT_Int local_28c;
  FT_String *local_288;
  FT_Face local_280;
  FT_Face local_278;
  FT_Open_Args local_270;
  code *local_230;
  code *local_200;
  code *local_1f0;
  code *local_1e8;
  FT_Stream local_1e0;
  undefined1 local_1d8 [16];
  char local_1c8;
  FT_Int local_1c0;
  undefined1 local_1b8 [32];
  int local_198;
  long local_190;
  code *local_160;
  uint local_158;
  FT_Pos local_150 [5];
  FT_GlyphSlot_conflict local_128;
  code *local_f8;
  FT_Generic_Finalizer local_f0 [3];
  long local_d8;
  FT_Size local_c8;
  FT_CharMap local_c0;
  code *local_98;
  undefined1 local_90 [88];
  code *local_38;
  
  t42face[3].available_sizes = (FT_Bitmap_Size *)0x0;
  t42face->num_faces = 1;
  pvVar19 = ft_module_get_service(&t42face->driver->root,"postscript-cmaps",'\x01');
  t42face[3].num_glyphs = (FT_Long)pvVar19;
  local_288 = (FT_String *)FT_Get_Module_Interface((t42face->driver->root).library,"psaux");
  t42face[3].family_name = local_288;
  if (local_288 == (FT_String *)0x0) {
    return 0xb;
  }
  memory = t42face->memory;
  local_28c = face_index;
  memset(&local_270,0,0x240);
  pFVar20 = (FT_String *)ft_mem_alloc(memory,0xc,(FT_Error *)&local_2e4);
  t42face[3].style_name = pFVar20;
  if (local_2e4 == 0) {
    *(undefined8 *)&t42face[3].num_fixed_sizes = 0xc;
    stream_00 = t42face->stream;
    local_2c0[0] = (FT_Face)((ulong)local_2c0[0] & 0xffffffff00000000);
    local_2d4 = num_params;
    local_298 = params;
    (*(code *)**(undefined8 **)(local_288 + 8))(&local_270,0,0);
    local_1d8 = (undefined1  [16])0x0;
    local_1c8 = '\0';
    local_1e0 = stream_00;
    FVar16 = FT_Stream_Seek(stream_00,0);
    local_2c0[0] = (FT_Face)CONCAT44(local_2c0[0]._4_4_,FVar16);
    if (FVar16 == 0) {
      FVar16 = FT_Stream_EnterFrame(stream_00,0x11);
      local_2c0[0] = (FT_Face)CONCAT44(local_2c0[0]._4_4_,FVar16);
      if (FVar16 == 0) {
        puVar5 = stream_00->cursor;
        auVar30[0] = -(*puVar5 == '%');
        auVar30[1] = -(puVar5[1] == '!');
        auVar30[2] = -(puVar5[2] == 'P');
        auVar30[3] = -(puVar5[3] == 'S');
        auVar30[4] = -(puVar5[4] == '-');
        auVar30[5] = -(puVar5[5] == 'T');
        auVar30[6] = -(puVar5[6] == 'r');
        auVar30[7] = -(puVar5[7] == 'u');
        auVar30[8] = -(puVar5[8] == 'e');
        auVar30[9] = -(puVar5[9] == 'T');
        auVar30[10] = -(puVar5[10] == 'y');
        auVar30[0xb] = -(puVar5[0xb] == 'p');
        auVar30[0xc] = -(puVar5[0xc] == 'e');
        auVar30[0xd] = -(puVar5[0xd] == 'F');
        auVar30[0xe] = -(puVar5[0xe] == 'o');
        auVar30[0xf] = -(puVar5[0xf] == 'n');
        auVar31[0] = -(puVar5[0x10] == 't');
        auVar31[1] = 0xff;
        auVar31[2] = 0xff;
        auVar31[3] = 0xff;
        auVar31[4] = 0xff;
        auVar31[5] = 0xff;
        auVar31[6] = 0xff;
        auVar31[7] = 0xff;
        auVar31[8] = 0xff;
        auVar31[9] = 0xff;
        auVar31[10] = 0xff;
        auVar31[0xb] = 0xff;
        auVar31[0xc] = 0xff;
        auVar31[0xd] = 0xff;
        auVar31[0xe] = 0xff;
        auVar31[0xf] = 0xff;
        auVar31 = auVar31 & auVar30;
        if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) != 0xffff) {
          local_2c0[0] = (FT_Face)CONCAT44(local_2c0[0]._4_4_,2);
        }
        FT_Stream_ExitFrame(stream_00);
        if ((uint)local_2c0[0] == 0) {
          FVar16 = FT_Stream_Seek(stream_00,0);
          local_2c0[0] = (FT_Face)CONCAT44(local_2c0[0]._4_4_,FVar16);
          if (FVar16 == 0) {
            count = stream_00->size;
            if (stream_00->read == (FT_Stream_IoFunc)0x0) {
              local_1d8._8_8_ = count;
              local_1d8._0_8_ = stream_00->base + stream_00->pos;
              local_1c8 = '\x01';
              FVar16 = FT_Stream_Skip(stream_00,count);
              local_2c0[0] = (FT_Face)CONCAT44(local_2c0[0]._4_4_,FVar16);
              if (FVar16 == 0) {
LAB_0017b88b:
                local_270._0_8_ = local_1d8._0_8_;
                local_270.memory_size = local_1d8._0_8_ + local_1d8._8_8_;
                local_270.memory_base = (FT_Byte *)local_270._0_8_;
              }
            }
            else {
              buffer = (FT_Byte *)ft_mem_alloc(memory,count,(FT_Error *)local_2c0);
              local_1d8._0_8_ = buffer;
              if ((uint)local_2c0[0] == 0) {
                FVar16 = FT_Stream_Read(stream_00,buffer,count);
                local_2c0[0] = (FT_Face)CONCAT44(local_2c0[0]._4_4_,FVar16);
                if (FVar16 == 0) {
                  local_1d8._8_8_ = count;
                  goto LAB_0017b88b;
                }
              }
            }
          }
        }
      }
    }
    if (((uint)local_2c0[0] != 0) && (local_1c8 == '\0')) {
      ft_mem_free(memory,(void *)local_1d8._0_8_);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_1d8._8_8_;
      local_1d8 = auVar11 << 0x40;
    }
    local_2e4 = (uint)local_2c0[0];
    params = local_298;
    num_params = local_2d4;
    if ((uint)local_2c0[0] == 0) {
      local_270._0_8_ = local_1d8._0_8_;
      pFVar24 = (FT_Face)(local_1d8._0_8_ + local_1d8._8_8_);
      local_270.pathname._0_4_ = 0;
      local_2a0 = pvVar19;
      local_270.memory_size = (FT_Long)pFVar24;
      (*(code *)local_270.params)(&local_270);
      local_278 = (FT_Face)&t42face[2].extensions;
      local_280 = (FT_Face)&t42face[1].num_fixed_sizes;
      local_2c8 = t42face + 1;
      do {
        uVar15 = local_270._0_8_;
        uVar18 = (uint)local_270.pathname;
        if (pFVar24 <= (ulong)local_270._0_8_) goto LAB_0017b1f8;
        cVar2 = *(char *)local_270._0_8_;
        if (((char *)(local_270._0_8_ + 0x18 + 1) < pFVar24 && cVar2 == 'F') &&
           (iVar17 = strncmp((char *)local_270._0_8_,"FontDirectory",0xd), iVar17 == 0)) {
          (*local_230)(&local_270);
          (*(code *)local_270.params)(&local_270);
          pFVar27 = (FT_Face)local_270._0_8_;
          while ((ulong)local_270._0_8_ < pFVar24) {
            if (((char *)((long)&((FT_Face)local_270._0_8_)->num_faces + 5U) < pFVar24 &&
                 *(char *)&((FT_Face)local_270._0_8_)->num_faces == 'k') &&
               (iVar17 = strncmp((char *)local_270._0_8_,"known",5), iVar17 == 0)) {
              (*local_230)(&local_270);
              (*local_200)(&local_270,local_2c0);
              if (local_2b0 == 3) {
                pFVar27 = (FT_Face)local_270._0_8_;
              }
              break;
            }
            (*local_230)(&local_270);
            if ((uint)local_270.pathname != 0) {
              uVar25 = 6;
              bVar12 = false;
              goto LAB_0017b1bc;
            }
            (*(code *)local_270.params)(&local_270);
          }
          uVar25 = 0;
          bVar12 = true;
          local_270._0_8_ = pFVar27;
LAB_0017b1bc:
          if (bVar12) {
LAB_0017b0bf:
            (*(code *)local_270.params)(&local_270);
            uVar25 = 0;
          }
        }
        else {
          if ((char *)(uVar15 + 2) < pFVar24 && cVar2 == '/') {
            pcVar23 = (char *)(uVar15 + 1);
            local_270._0_8_ = pcVar23;
            (*local_230)(&local_270);
            uVar25 = 6;
            uVar18 = uVar25;
            if ((uint)local_270.pathname == 0) {
              if ((ulong)local_270._0_8_ < pFVar24 &&
                  (int)(local_270._0_8_ - (long)pcVar23) - 1U < 0x15) {
                local_2a8 = (char *)(local_270._0_8_ - (long)pcVar23 & 0xffffffff);
                lVar26 = 0;
                uVar28 = local_2e0 & 0xffffffff;
                local_2d0 = pFVar24;
                do {
                  pcVar22 = *(char **)((long)&t42_keywords[0].ident + lVar26);
                  if (pcVar22 == (char *)0x0) {
                    uVar25 = 9;
                  }
                  else {
                    uVar25 = 0;
                    if (*pcVar23 == *pcVar22) {
                      local_2e0 = CONCAT44(local_2e0._4_4_,(int)uVar28);
                      pcVar21 = (char *)strlen(pcVar22);
                      if ((local_2a8 == pcVar21) &&
                         (iVar17 = bcmp(pcVar23,pcVar22,(size_t)local_2a8), iVar17 == 0)) {
                        iVar17 = *(int *)((long)&t42_keywords[0].type + lVar26);
                        if (iVar17 == 0xb) {
                          (**(code **)((long)&t42_keywords[0].reader + lVar26))(t42face,&local_270);
                        }
                        else {
                          iVar4 = *(int *)((long)&t42_keywords[0].location + lVar26);
                          local_2c0[0] = local_280;
                          if ((iVar4 != 2) && (local_2c0[0] = local_278, iVar4 != 5)) {
                            local_2c0[0] = local_2c8;
                          }
                          if (iVar17 - 9U < 2) {
                            local_270.pathname._0_4_ = (*local_1e8)();
                          }
                          else {
                            local_270.pathname._0_4_ =
                                 (*local_1f0)(&local_270,(long)&t42_keywords[0].ident + lVar26,
                                              local_2c0,0,0);
                          }
                        }
                        uVar25 = 1;
                        if ((uint)local_270.pathname == 0) {
                          uVar25 = 7;
                        }
                        uVar18 = (uint)local_2e0;
                        if ((uint)local_270.pathname != 0) {
                          uVar18 = (uint)local_270.pathname;
                        }
                        uVar28 = (ulong)uVar18;
                      }
                      else {
                        uVar28 = local_2e0 & 0xffffffff;
                      }
                    }
                  }
                  if ((uVar25 != 0) && (uVar25 != 9)) {
                    if (uVar25 != 7) goto LAB_0017b17a;
                    break;
                  }
                  lVar26 = lVar26 + 0x30;
                } while (lVar26 != 0x3c0);
                uVar25 = 0;
LAB_0017b17a:
                local_2e0 = CONCAT44(local_2e0._4_4_,(int)uVar28);
                pFVar24 = local_2d0;
                uVar18 = uVar25;
              }
              else {
                uVar25 = 0;
                uVar18 = uVar25;
              }
            }
          }
          else {
            (*local_230)(&local_270);
            uVar25 = 6;
            uVar18 = (uint)local_270.pathname;
          }
          if (uVar18 == 0) goto LAB_0017b0bf;
        }
      } while (uVar25 == 0);
      uVar18 = (uint)local_270.pathname;
      if (uVar25 != 6) {
        uVar18 = (uint)local_2e0;
      }
LAB_0017b1f8:
      params = local_298;
      pvVar19 = local_2a0;
      num_params = local_2d4;
      local_2e4 = uVar18;
      if (uVar18 == 0) {
        if (*(char *)((long)&t42face[2].driver + 1) == '*') {
          local_2e0 = (ulong)local_158;
          t42face[2].max_advance_width = (undefined2)local_158;
          t42face[2].max_advance_height = local_158._2_2_;
          if (local_d8 == 0) {
            local_2e4 = 3;
          }
          local_d8 = 0;
          t42face[2].generic.finalizer = local_f0[0];
          t42face[2].size = local_c8;
          t42face[2].charmap = local_c0;
          t42face[2].bbox.xMin = local_150[0];
          t42face[2].glyph = local_128;
          local_150[0] = 0;
          local_2d0 = (FT_Face)0x0;
          local_128 = (FT_GlyphSlot_conflict)0x0;
          if (*(int *)&t42face[2].style_name == 1) {
            pcVar23 = (char *)(long)local_198;
            local_2c8 = (FT_Face)0x0;
            if (0 < (long)pcVar23) {
              pFVar24 = (FT_Face)0x0;
              local_2c8 = (FT_Face)0x0;
              local_2d0 = (FT_Face)0x0;
              local_2a8 = pcVar23;
              do {
                *(undefined2 *)(*(long *)&t42face[2].num_charmaps + (long)pFVar24 * 2) = 0;
                t42face[2].charmaps[(long)pFVar24] = (FT_CharMap)".notdef";
                pcVar22 = *(char **)(local_190 + (long)pFVar24 * 8);
                if (pcVar22 != (char *)0x0 && 0 < (int)(uint)local_2e0) {
                  pFVar6 = t42face[2].glyph;
                  uVar28 = 0;
                  do {
                    __s2 = (&pFVar6->library)[uVar28];
                    iVar17 = strcmp(pcVar22,(char *)__s2);
                    if (iVar17 == 0) {
                      *(short *)(*(long *)&t42face[2].num_charmaps + (long)pFVar24 * 2) =
                           (short)uVar28;
                      t42face[2].charmaps[(long)pFVar24] = (FT_CharMap)__s2;
                      iVar17 = strcmp(".notdef",(char *)__s2);
                      pcVar23 = local_2a8;
                      pvVar19 = local_2a0;
                      if (iVar17 != 0) {
                        if ((int)pFVar24 < (int)local_2d0) {
                          local_2d0 = pFVar24;
                        }
                        local_2d0 = (FT_Face)((ulong)local_2d0 & 0xffffffff);
                        iVar17 = (int)local_2c8;
                        local_2c8 = (FT_Face)((ulong)local_2c8 & 0xffffffff);
                        if ((long)iVar17 <= (long)pFVar24) {
                          local_2c8 = (FT_Face)(ulong)((int)pFVar24 + 1);
                        }
                      }
                      break;
                    }
                    uVar28 = uVar28 + 1;
                    pcVar23 = local_2a8;
                    pvVar19 = local_2a0;
                  } while (local_2e0 != uVar28);
                }
                pFVar24 = (FT_Face)((long)&pFVar24->num_faces + 1);
              } while (pFVar24 != (FT_Face)pcVar23);
            }
            *(int *)&t42face[2].field_0x3c = (int)local_2d0;
            *(int *)&t42face[2].available_sizes = (int)local_2c8;
            t42face[2].num_fixed_sizes = local_1c0;
            params = local_298;
            num_params = local_2d4;
          }
        }
        else {
          local_2e4 = 2;
        }
      }
    }
  }
  if (local_160 != (code *)0x0) {
    (*local_160)(local_1b8);
  }
  FVar14 = local_28c;
  if (local_98 != (code *)0x0) {
    (*local_98)(local_f0);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(local_150);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(local_90);
  }
  if (local_1c8 == '\0') {
    ft_mem_free((FT_Memory)local_270.stream,(void *)local_1d8._0_8_);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_1d8._8_8_;
    local_1d8 = auVar13 << 0x40;
  }
  (*(code *)CONCAT44(local_270._52_4_,local_270.num_params))();
  if (FVar14 < 0 || local_2e4 != 0) {
    return local_2e4;
  }
  if ((short)FVar14 != 0) {
    return 6;
  }
  iVar17._0_2_ = t42face[2].max_advance_width;
  iVar17._2_2_ = t42face[2].max_advance_height;
  t42face->num_glyphs = (long)iVar17;
  t42face->num_charmaps = 0;
  t42face->face_index = 0;
  uVar28 = t42face->face_flags;
  t42face->face_flags = uVar28 | 0x211;
  if (*(char *)&t42face[1].style_name != '\0') {
    t42face->face_flags = uVar28 | 0x215;
  }
  pbVar1 = (byte *)((long)&t42face->face_flags + 1);
  *pbVar1 = *pbVar1 | 8;
  pcVar23 = (char *)t42face[1].style_flags;
  t42face->family_name = pcVar23;
  t42face->style_name = "Regular";
  if (pcVar23 == (char *)0x0) {
    if (t42face[2].family_name != (FT_String *)0x0) {
      t42face->family_name = t42face[2].family_name;
    }
  }
  else {
    pcVar22 = (char *)t42face[1].face_flags;
    if (pcVar22 != (char *)0x0) {
      while (cVar2 = *pcVar22, cVar2 != '\0') {
        cVar3 = *pcVar23;
        if (cVar2 == cVar3) {
          pcVar23 = pcVar23 + 1;
LAB_0017b547:
          pcVar22 = pcVar22 + 1;
        }
        else {
          if ((cVar2 == '-') || (cVar2 == ' ')) goto LAB_0017b547;
          if ((cVar3 != ' ') && (cVar3 != '-')) {
            if (cVar3 == '\0') {
              t42face->style_name = pcVar22;
            }
            break;
          }
          pcVar23 = pcVar23 + 1;
        }
      }
    }
  }
  t42face->num_fixed_sizes = 0;
  t42face->available_sizes = (FT_Bitmap_Size *)0x0;
  local_270.flags = 9;
  local_270.driver = FT_Get_Module((t42face->driver->root).library,"truetype");
  local_270.memory_base = (FT_Byte *)t42face[3].style_name;
  local_270.memory_size = *(FT_Long *)&t42face[3].num_fixed_sizes;
  if (num_params != 0) {
    local_270._0_8_ = local_270._0_8_ | 0x10;
    local_270.num_params = num_params;
    local_270.params = params;
  }
  uVar18 = FT_Open_Face((t42face->driver->root).library,&local_270,0,
                        (FT_Face_conflict *)&t42face[3].available_sizes);
  if (uVar18 != 0) {
    return uVar18;
  }
  FT_Done_Size(*(FT_Size *)(t42face[3].available_sizes + 5));
  pFVar7 = t42face[3].available_sizes;
  FVar8 = pFVar7[3].x_ppem;
  FVar9 = pFVar7[3].y_ppem;
  FVar10 = *(FT_Pos *)(pFVar7 + 4);
  (t42face->bbox).xMin = pFVar7[3].size;
  (t42face->bbox).yMin = FVar8;
  (t42face->bbox).xMax = FVar9;
  (t42face->bbox).yMax = FVar10;
  t42face->units_per_EM = (FT_UShort)pFVar7[4].size;
  t42face->ascender = *(FT_Short *)((long)&pFVar7[4].size + 2);
  t42face->descender = *(FT_Short *)((long)&pFVar7[4].size + 4);
  t42face->height = *(FT_Short *)((long)&pFVar7[4].size + 6);
  t42face->max_advance_width = (FT_Short)pFVar7[4].x_ppem;
  t42face->max_advance_height = *(FT_Short *)((long)&pFVar7[4].x_ppem + 2);
  t42face->underline_position = *(FT_Short *)((long)&t42face[1].style_name + 2);
  t42face->underline_thickness = *(FT_Short *)((long)&t42face[1].style_name + 4);
  t42face->style_flags = 0;
  uVar28 = (ulong)(t42face[1].family_name != (FT_String *)0x0);
  t42face->style_flags = uVar28;
  if ((pFVar7->y_ppem & 2) != 0) {
    t42face->style_flags = uVar28 | 2;
  }
  if ((pFVar7->x_ppem & 0x20) != 0) {
    *(byte *)&t42face->face_flags = (byte)t42face->face_flags | 0x20;
  }
  if (pvVar19 == (FT_Pointer)0x0) {
    return 0;
  }
  puVar29 = *(undefined8 **)(local_288 + 0x40);
  local_270.memory_base = (FT_Byte *)0x10003756e6963;
  local_270._0_8_ = t42face;
  uVar18 = FT_CMap_New((FT_CMap_Class)puVar29[3],(FT_Pointer)0x0,(FT_CharMap)&local_270,
                       (FT_CMap_conflict *)0x0);
  if (uVar18 != 0 && (char)uVar18 != -0x5d) {
    return uVar18;
  }
  local_270.memory_base._0_6_ = CONCAT24(7,(FT_Encoding)local_270.memory_base);
  uVar18 = 0;
  switch(*(undefined4 *)&t42face[2].style_name) {
  case 1:
    local_270.memory_base = (FT_Byte *)CONCAT44(local_270.memory_base._4_4_,0x41444243);
    local_270.memory_base = (FT_Byte *)CONCAT26(2,local_270.memory_base._0_6_);
    puVar29 = puVar29 + 2;
    break;
  case 2:
    local_270.memory_base = (FT_Byte *)CONCAT44(local_270.memory_base._4_4_,0x41444f42);
    local_270.memory_base = (FT_Byte *)((ulong)local_270.memory_base & 0xffffffffffff);
    break;
  case 3:
    puVar29 = puVar29 + 3;
    local_270.memory_base = (FT_Byte *)CONCAT44(local_270.memory_base._4_4_,0x6c617431);
    local_270.memory_base = (FT_Byte *)CONCAT26(3,local_270.memory_base._0_6_);
    break;
  case 4:
    local_270.memory_base = (FT_Byte *)CONCAT44(local_270.memory_base._4_4_,0x41444245);
    local_270.memory_base = (FT_Byte *)CONCAT26(1,local_270.memory_base._0_6_);
    puVar29 = puVar29 + 1;
    break;
  default:
    clazz = (FT_CMap_Class)0x0;
    goto LAB_0017b835;
  }
  clazz = (FT_CMap_Class)*puVar29;
LAB_0017b835:
  if (clazz != (FT_CMap_Class)0x0) {
    uVar18 = FT_CMap_New(clazz,(FT_Pointer)0x0,(FT_CharMap)&local_270,(FT_CMap_conflict *)0x0);
  }
  return uVar18;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Face_Init( FT_Stream      stream,
                 FT_Face        t42face,       /* T42_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    T42_Face            face  = (T42_Face)t42face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    FT_Face             root  = (FT_Face)&face->root;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info  = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->ttf_face       = NULL;
    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T42_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    FT_TRACE2(( "Type 42 driver\n" ));

    /* open the tokenizer, this will also check the font format */
    error = T42_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T42_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Now load the font program into the face object */

    /* Init the face object fields */
    /* Now set up root face fields */

    root->num_glyphs   = type1->num_glyphs;
    root->num_charmaps = 0;
    root->face_index   = 0;

    root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                        FT_FACE_FLAG_HORIZONTAL  |
                        FT_FACE_FLAG_GLYPH_NAMES;

    if ( info->is_fixed_pitch )
      root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

#ifdef TT_CONFIG_OPTION_BYTECODE_INTERPRETER
    root->face_flags |= FT_FACE_FLAG_HINTER;
#endif

    /* XXX: TODO -- add kerning with .afm support */

    /* get style name -- be careful, some broken fonts only */
    /* have a `/FontName' dictionary entry!                 */
    root->family_name = info->family_name;
    /* assume "Regular" style if we don't know better */
    root->style_name = (char *)"Regular";
    if ( root->family_name )
    {
      char*  full   = info->full_name;
      char*  family = root->family_name;


      if ( full )
      {
        while ( *full )
        {
          if ( *full == *family )
          {
            family++;
            full++;
          }
          else
          {
            if ( *full == ' ' || *full == '-' )
              full++;
            else if ( *family == ' ' || *family == '-' )
              family++;
            else
            {
              if ( !*family )
                root->style_name = full;
              break;
            }
          }
        }
      }
    }
    else
    {
      /* do we have a `/FontName'? */
      if ( type1->font_name )
        root->family_name = type1->font_name;
    }

    /* no embedded bitmap support */
    root->num_fixed_sizes = 0;
    root->available_sizes = NULL;

    /* Load the TTF font embedded in the T42 font */
    {
      FT_Open_Args  args;


      args.flags       = FT_OPEN_MEMORY | FT_OPEN_DRIVER;
      args.driver      = FT_Get_Module( FT_FACE_LIBRARY( face ),
                                        "truetype" );
      args.memory_base = face->ttf_data;
      args.memory_size = face->ttf_size;

      if ( num_params )
      {
        args.flags     |= FT_OPEN_PARAMS;
        args.num_params = num_params;
        args.params     = params;
      }

      error = FT_Open_Face( FT_FACE_LIBRARY( face ),
                            &args, 0, &face->ttf_face );
    }

    if ( error )
      goto Exit;

    FT_Done_Size( face->ttf_face->size );

    /* Ignore info in FontInfo dictionary and use the info from the  */
    /* loaded TTF font.  The PostScript interpreter also ignores it. */
    root->bbox         = face->ttf_face->bbox;
    root->units_per_EM = face->ttf_face->units_per_EM;

    root->ascender  = face->ttf_face->ascender;
    root->descender = face->ttf_face->descender;
    root->height    = face->ttf_face->height;

    root->max_advance_width  = face->ttf_face->max_advance_width;
    root->max_advance_height = face->ttf_face->max_advance_height;

    root->underline_position  = (FT_Short)info->underline_position;
    root->underline_thickness = (FT_Short)info->underline_thickness;

    /* compute style flags */
    root->style_flags = 0;
    if ( info->italic_angle )
      root->style_flags |= FT_STYLE_FLAG_ITALIC;

    if ( face->ttf_face->style_flags & FT_STYLE_FLAG_BOLD )
      root->style_flags |= FT_STYLE_FLAG_BOLD;

    if ( face->ttf_face->face_flags & FT_FACE_FLAG_VERTICAL )
      root->face_flags |= FT_FACE_FLAG_VERTICAL;

    {
      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }
  Exit:
    return error;
  }